

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnIndexedFuncRef(TypeChecker *this,Index *out_index)

{
  bool bVar1;
  Enum EVar2;
  Index IVar3;
  Result rhs;
  undefined8 uVar4;
  char *in_RCX;
  Result local_8c;
  string local_88;
  undefined1 local_68 [8];
  string message;
  undefined1 local_40 [8];
  TypeVector actual;
  Type type;
  Index *out_index_local;
  TypeChecker *this_local;
  Result result;
  
  this_local._4_4_ =
       PeekType(this,0,(Type *)&actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
  EVar2 = Type::operator_cast_to_Enum
                    ((Type *)&actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((EVar2 != Any) &&
     (bVar1 = Type::IsReferenceWithIndex
                        ((Type *)&actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar1)) {
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_40);
    message.field_2._12_4_ = this_local._4_4_;
    bVar1 = Succeeded(this_local._4_4_);
    if (bVar1) {
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_40,
                 (value_type *)
                 &actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_88,(_anonymous_namespace_ *)local_40,(TypeVector *)0x0,in_RCX);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   "type mismatch in call_ref, expected reference but got ",&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    uVar4 = std::__cxx11::string::c_str();
    PrintError(this,"%s",uVar4);
    Result::Result(&local_8c,Error);
    this_local._4_4_ = local_8c.enum_;
    std::__cxx11::string::~string((string *)local_68);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_40);
  }
  bVar1 = Succeeded(this_local._4_4_);
  if (bVar1) {
    IVar3 = Type::GetReferenceIndex
                      ((Type *)&actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
    *out_index = IVar3;
  }
  rhs = DropTypes(this,1);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnIndexedFuncRef(Index* out_index) {
  Type type;
  Result result = PeekType(0, &type);
  if (!(type == Type::Any || type.IsReferenceWithIndex())) {
    TypeVector actual;
    if (Succeeded(result)) {
      actual.push_back(type);
    }
    std::string message =
        "type mismatch in call_ref, expected reference but got " +
        TypesToString(actual);
    PrintError("%s", message.c_str());
    result = Result::Error;
  }
  if (Succeeded(result)) {
    *out_index = type.GetReferenceIndex();
  }
  result |= DropTypes(1);
  return result;
}